

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::cp_d(CPU *this)

{
  cp_r8(this,this->regs->d);
  return 1;
}

Assistant:

int CPU::cp_d() {
    cp_r8(regs.d);
    return 1;
}